

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O1

uint8_t Show_bmp(uint32_t x,uint32_t y,char *path)

{
  FILE *__stream;
  size_t sVar1;
  size_t sVar2;
  char *__s;
  uint uVar3;
  uint8_t *__ptr;
  BITMAPINFOHEADER InfoHead;
  BITMAPFILEHEADER FileHead;
  uint local_70;
  uint local_6c;
  uint32_t local_68;
  ushort local_64;
  ushort local_62;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  short local_46;
  uint local_44;
  uint local_3c;
  ulong local_38;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    return 0xff;
  }
  sVar1 = fread(&local_46,0xe,1,__stream);
  if ((int)sVar1 != 1) {
    puts("Read header error!");
    fclose(__stream);
    return 0xfe;
  }
  if (local_46 != 0x4d42) {
    puts("It\'s not a BMP file");
    fclose(__stream);
    return 0xfd;
  }
  puts("\n*****************************************");
  printf("BMP_cfSize:%d \n",(ulong)local_44);
  printf("BMP_cfoffBits:%d \n",(ulong)local_3c);
  sVar1 = fread(&local_70,0x28,1,__stream);
  if ((int)sVar1 != 1) {
    puts("Read infoheader error!");
    fclose(__stream);
    return 0xfc;
  }
  printf("BMP_ciSize:%d \n",(ulong)local_70);
  printf("BMP_ciWidth:%d \n",(ulong)local_6c);
  printf("BMP_ciHeight:%d \n");
  printf("BMP_ciPlanes:%x \n",(ulong)local_64);
  printf("BMP_ciBitCount:%x \n",(ulong)local_62);
  printf("BMP_ciCompress:%x \n",(ulong)local_60);
  printf("BMP_ciSizeImage:%x \n",(ulong)local_5c);
  printf("BMP_ciXPelsPerMeter:%x \n",(ulong)local_58);
  printf("BMP_ciYPelsPerMeter:%x \n",(ulong)local_54);
  printf("BMP_ciClrUsed:%x \n",(ulong)local_50);
  printf("BMP_ciClrImportant:%x \n",(ulong)local_4c);
  puts("*****************************************\n");
  sVar1 = (size_t)(local_44 - local_3c);
  bytesPerLine = local_6c * local_62 + 0x1f >> 3 & 0xfffffffc;
  imageSize = bytesPerLine * local_68;
  skip = -(local_6c * local_62 >> 3) & 3;
  local_38 = (ulong)local_3c;
  printf("total_length:%d,%d\n",(ulong)local_5c,sVar1);
  printf("bytesPerLine = %d\n",(ulong)bytesPerLine);
  printf("imageSize = %d\n",(ulong)imageSize);
  printf("skip = %d\n",(ulong)skip);
  bmp_width = local_6c;
  bmp_height = local_68;
  bmp_BitCount = (uint8_t)local_62;
  bmp_src_buf = (uint8_t *)calloc(1,sVar1);
  if ((bmp_src_buf != (uint8_t *)0x0) &&
     (bmp_dst_buf = (uint8_t *)calloc(1,sVar1), bmp_dst_buf != (uint8_t *)0x0)) {
    fseek(__stream,local_38,0);
    __ptr = bmp_src_buf;
    do {
      while( true ) {
        sVar2 = fread(__ptr,1,sVar1,__stream);
        if ((int)sVar2 != 0) break;
        usleep(100);
      }
      __ptr = __ptr + (sVar2 & 0xffffffff);
      uVar3 = (int)sVar1 - (int)sVar2;
      sVar1 = (size_t)uVar3;
    } while (uVar3 != 0);
    if (bmp_BitCount == '\b') {
      fseek(__stream,0x36,0);
      sVar1 = fread(palette,1,0x400,__stream);
      if ((int)sVar1 == 0x400) goto LAB_00105994;
      __s = "Error: fread != 1024";
      goto LAB_0010595c;
    }
    if (bmp_BitCount == '\x04') {
      fseek(__stream,0x36,0);
      sVar1 = fread(palette,1,0x40,__stream);
      if ((int)sVar1 != 0x40) {
        __s = "Error: fread != 64";
        goto LAB_0010595c;
      }
    }
    else {
      if (bmp_BitCount != '\x01') goto LAB_00105994;
      fseek(__stream,0x36,0);
      sVar1 = fread(palette,1,8,__stream);
      if ((int)sVar1 != 8) {
        __s = "Error: fread != 8";
        goto LAB_0010595c;
      }
    }
    bmp_dst_buf = (uint8_t *)calloc(1,(ulong)(local_68 * local_6c));
    if (bmp_dst_buf != (uint8_t *)0x0) {
LAB_00105994:
      Bitmap_format_Matrix(bmp_dst_buf,bmp_src_buf);
      DrawMatrix((uint16_t)x,(uint16_t)y,(uint16_t)local_6c,(uint16_t)local_68,bmp_dst_buf);
      fclose(__stream);
      return '\0';
    }
  }
  __s = "Load > malloc bmp out of memory!";
LAB_0010595c:
  puts(__s);
  return 0xfb;
}

Assistant:

uint8_t Show_bmp(uint32_t x, uint32_t y,char *path)
{
	FILE *fp;//bmp�ļ�ָ��
	BITMAPFILEHEADER FileHead;
	BITMAPINFOHEADER InfoHead;
	uint32_t total_length;
	uint8_t *buf = NULL;
	uint32_t ret = -1;
	 
	fp = fopen(path,"rb");
	if (fp == NULL)
	{
		return(-1);
	}
 
	ret = fread(&FileHead, sizeof(BITMAPFILEHEADER),1, fp);
	if (ret != 1)
	{
		printf("Read header error!\n");
		fclose(fp);
		return(-2);
	}

	//�����Ƿ���bmpͼ��
	if (FileHead.cfType != 0x4D42)//�ļ����ͣ�"BM"(0x4D42)
	{
		printf("It's not a BMP file\n");
		fclose(fp);
		return(-3);
	}
	
	printf("\n*****************************************\n");
	printf("BMP_cfSize:%d \n", FileHead.cfSize);
 	printf("BMP_cfoffBits:%d \n", FileHead.cfoffBits);
	
	ret = fread((char *)&InfoHead, sizeof(BITMAPINFOHEADER),1, fp);
	if (ret != 1)
	{
		printf("Read infoheader error!\n");
		fclose(fp);
		return(-4);
	}
	
	printf("BMP_ciSize:%d \n", InfoHead.ciSize);
 	printf("BMP_ciWidth:%d \n", InfoHead.ciWidth);
	printf("BMP_ciHeight:%d \n", InfoHead.ciHeight);
	printf("BMP_ciPlanes:%x \n", InfoHead.ciPlanes);
	printf("BMP_ciBitCount:%x \n", InfoHead.ciBitCount);
	printf("BMP_ciCompress:%x \n", InfoHead.ciCompress);
	printf("BMP_ciSizeImage:%x \n", InfoHead.ciSizeImage);
	printf("BMP_ciXPelsPerMeter:%x \n", InfoHead.ciXPelsPerMeter);
	printf("BMP_ciYPelsPerMeter:%x \n", InfoHead.ciYPelsPerMeter);
	printf("BMP_ciClrUsed:%x \n", InfoHead.ciClrUsed);
	printf("BMP_ciClrImportant:%x \n", InfoHead.ciClrImportant);
 	printf("*****************************************\n\n");
	
	total_length = FileHead.cfSize-FileHead.cfoffBits;
	bytesPerLine=((InfoHead.ciWidth*InfoHead.ciBitCount+31)>>5)<<2;
	imageSize=bytesPerLine*InfoHead.ciHeight;
	skip=(4-((InfoHead.ciWidth*InfoHead.ciBitCount)>>3))&3;
	
	printf("total_length:%d,%d\n", InfoHead.ciSizeImage,FileHead.cfSize-FileHead.cfoffBits);
	printf("bytesPerLine = %d\n", bytesPerLine);
	printf("imageSize = %d\n", imageSize);
	printf("skip = %d\n", skip);
	
    bmp_width = InfoHead.ciWidth;
    bmp_height = InfoHead.ciHeight;
	bmp_BitCount = InfoHead.ciBitCount;
	
    bmp_src_buf = (uint8_t*)calloc(1,total_length);
    if(bmp_src_buf == NULL){
        printf("Load > malloc bmp out of memory!\n");
        return -5;
    }
	
	bmp_dst_buf = (uint8_t*)calloc(1,total_length);
    if(bmp_dst_buf == NULL){
        printf("Load > malloc bmp out of memory!\n");
        return -5;
    }

	 //��ת��������
    fseek(fp, FileHead.cfoffBits, SEEK_SET);
	
	//ÿ���ֽ���
    buf = bmp_src_buf;
    while ((ret = fread(buf,1,total_length,fp)) >= 0) 
	{
        if (ret == 0) 
		{
            usleep(100);
            continue;
        }
		buf = ((uint8_t*)buf) + ret;
        total_length = total_length - ret;
        if(total_length == 0)
            break;
    }
	
	//��ת�����԰�
	switch(bmp_BitCount)
	{	
		case 1:
			fseek(fp, 54, SEEK_SET);
			ret = fread(palette,1,4*2,fp);
			if (ret != 8) 
			{
				printf("Error: fread != 8\n");
				return -5;
			}
		
			bmp_dst_buf = (uint8_t*)calloc(1,InfoHead.ciWidth * InfoHead.ciHeight);
			if(bmp_dst_buf == NULL)
			{
				printf("Load > malloc bmp out of memory!\n");
				return -5;
			}
		break;
		
		case 4:
			fseek(fp, 54, SEEK_SET);
			ret = fread(palette,1,4*16,fp);
			if (ret != 64) 
			{
				printf("Error: fread != 64\n");
				return -5;
			}
		
			bmp_dst_buf = (uint8_t*)calloc(1,InfoHead.ciWidth * InfoHead.ciHeight);
			if(bmp_dst_buf == NULL)
			{
				printf("Load > malloc bmp out of memory!\n");
				return -5;
			}
		break;
		
		case 8:
			fseek(fp, 54, SEEK_SET);

			ret = fread(palette,1,4*256,fp);

			if (ret != 1024) 
			{
				printf("Error: fread != 1024\n");
				return -5;
			}
		break;
		
		default:
		break;
	}

	Bitmap_format_Matrix(bmp_dst_buf,bmp_src_buf);
	DrawMatrix(x, y,InfoHead.ciWidth, InfoHead.ciHeight, bmp_dst_buf);

	fclose(fp);
	return(0);
}